

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *arena;
  ServiceDescriptorProto *from;
  uint uVar1;
  ServiceDescriptorProto *to;
  ulong uVar2;
  long lVar3;
  
  uVar1 = length;
  if (already_allocated < length) {
    uVar1 = already_allocated;
  }
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      GenericTypeHandler<google::protobuf::ServiceDescriptorProto>::Merge
                ((ServiceDescriptorProto *)other_elems[uVar2],
                 (ServiceDescriptorProto *)our_elems[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if (already_allocated < length) {
    arena = this->arena_;
    lVar3 = 0;
    do {
      from = (ServiceDescriptorProto *)other_elems[already_allocated + lVar3];
      to = Arena::CreateMaybeMessage<google::protobuf::ServiceDescriptorProto>(arena);
      GenericTypeHandler<google::protobuf::ServiceDescriptorProto>::Merge(from,to);
      our_elems[already_allocated + lVar3] = to;
      lVar3 = lVar3 + 1;
    } while (length - already_allocated != (int)lVar3);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArena();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}